

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseConst.cpp
# Opt level: O1

bool __thiscall
glslang::TIntermediate::parseConstTree
          (TIntermediate *this,TIntermNode *root,TConstUnionArray *unionArray,
          TOperator constructorType,TType *t,bool singleConstantParam)

{
  TConstTraverser it;
  undefined **local_a8;
  undefined1 local_a0;
  undefined7 local_9f;
  undefined4 uStack_98;
  TPoolAllocator *local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined4 local_70;
  undefined **local_68;
  TConstUnionVector *local_60;
  undefined4 local_58;
  TType *local_50;
  TOperator local_48;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_3c;
  undefined8 local_38;
  
  local_43 = 0;
  if (root != (TIntermNode *)0x0) {
    local_a8 = &PTR__TIntermTraverser_0093ba08;
    local_a0 = 1;
    local_90 = (TPoolAllocator *)0x0;
    uStack_88 = 0;
    local_80 = 0;
    uStack_78 = 0;
    local_9f = 0;
    uStack_98 = 0;
    local_90 = GetThreadPoolAllocator();
    uStack_88 = 0;
    local_80 = 0;
    uStack_78 = 0;
    local_a8 = &PTR__TConstTraverser_00944be0;
    local_68 = &PTR__TConstUnionArray_0093b5a8;
    local_60 = unionArray->unionArray;
    local_43 = 0;
    local_3c = 0;
    local_38 = 0;
    local_70 = 0;
    local_58 = 0;
    local_50 = t;
    local_48 = constructorType;
    local_44 = singleConstantParam;
    (*root->_vptr_TIntermNode[2])(root,&local_a8);
  }
  return (bool)local_43;
}

Assistant:

bool TIntermediate::parseConstTree(TIntermNode* root, TConstUnionArray unionArray, TOperator constructorType, const TType& t, bool singleConstantParam)
{
    if (root == nullptr)
        return false;

    TConstTraverser it(unionArray, singleConstantParam, constructorType, t);

    root->traverse(&it);
    if (it.error)
        return true;
    else
        return false;
}